

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O1

void printComponent(ComponentPtr *component,size_t c,string *indent,bool includeMaths)

{
  _Alloc_hider _Var1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  long *plVar6;
  undefined7 in_register_00000009;
  size_type *psVar7;
  bool includeMaths_00;
  ulong uVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  size_t c2;
  string con;
  ComponentPtr child;
  VariablePtr ev;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  long *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  long local_70 [2];
  undefined4 local_5c;
  long local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  string *local_48;
  ulong local_40;
  ComponentPtr *local_38;
  
  if (c == 0xffffffffffffffff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"COMPONENT: \'",0xc);
    libcellml::NamedEntity::name_abi_cxx11_();
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_c0._M_dataplus._M_p,local_c0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
  }
  else {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(indent->_M_dataplus)._M_p,indent->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[",1);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]: ",3);
    libcellml::NamedEntity::name_abi_cxx11_();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,local_c0._M_dataplus._M_p,local_c0._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  local_5c = (undefined4)CONCAT71(in_register_00000009,includeMaths);
  libcellml::Entity::id_abi_cxx11_();
  iVar2 = std::__cxx11::string::compare((char *)&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", id: ",6);
    libcellml::Entity::id_abi_cxx11_();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_c0._M_dataplus._M_p,local_c0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(indent->_M_dataplus)._M_p,indent->_M_string_length);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,FIXED_INDENT_abi_cxx11_._M_dataplus._M_p,
                      FIXED_INDENT_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"VARIABLES: ",0xb);
  libcellml::Component::variableCount();
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," variables",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  lVar4 = libcellml::Component::variableCount();
  if (lVar4 != 0) {
    uVar8 = 0;
    local_48 = indent;
    local_38 = component;
    do {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(indent->_M_dataplus)._M_p,indent->_M_string_length)
      ;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,FIXED_INDENT_abi_cxx11_._M_dataplus._M_p,
                          FIXED_INDENT_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,FIXED_INDENT_abi_cxx11_._M_dataplus._M_p,
                 FIXED_INDENT_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
      local_40 = uVar8 + 1;
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]: ",3);
      libcellml::Component::variable((ulong)&local_a0);
      libcellml::NamedEntity::name_abi_cxx11_();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,local_c0._M_dataplus._M_p,local_c0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length);
      }
      libcellml::Component::variable((ulong)&local_a0);
      libcellml::Variable::units();
      _Var1._M_p = local_c0._M_dataplus._M_p;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._M_string_length);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var1._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [",2);
        libcellml::Component::variable((ulong)&local_80);
        libcellml::Variable::units();
        libcellml::NamedEntity::name_abi_cxx11_();
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_c0._M_dataplus._M_p,
                            local_c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length);
        }
        if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
        }
      }
      libcellml::Component::variable((ulong)&local_a0);
      libcellml::Variable::initialValue_abi_cxx11_();
      iVar2 = std::__cxx11::string::compare((char *)&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length);
      }
      if (iVar2 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", initial = ",0xc)
        ;
        libcellml::Component::variable((ulong)&local_a0);
        libcellml::Variable::initialValue_abi_cxx11_();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,local_c0._M_dataplus._M_p,local_c0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length);
        }
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
      std::ostream::put('8');
      std::ostream::flush();
      libcellml::Component::variable((ulong)&local_c0);
      lVar4 = libcellml::Variable::equivalentVariableCount();
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._M_string_length);
      }
      if (lVar4 != 0) {
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(indent->_M_dataplus)._M_p,
                            indent->_M_string_length);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,FIXED_INDENT_abi_cxx11_._M_dataplus._M_p,
                            FIXED_INDENT_abi_cxx11_._M_string_length);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,FIXED_INDENT_abi_cxx11_._M_dataplus._M_p,
                            FIXED_INDENT_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,FIXED_INDENT_abi_cxx11_._M_dataplus._M_p,
                   FIXED_INDENT_abi_cxx11_._M_string_length);
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,anon_var_dwarf_ab94,anon_var_dwarf_ab94 + 0xd);
        uVar8 = 0;
        while( true ) {
          libcellml::Component::variable((ulong)&local_a0);
          uVar5 = libcellml::Variable::equivalentVariableCount();
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length);
          }
          if (uVar5 <= uVar8) break;
          libcellml::Component::variable((ulong)&local_a0);
          libcellml::Variable::equivalentVariable((ulong)&local_58);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length);
          }
          if (local_58 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"WHOOPS! Null equivalent variable!",0x21);
          }
          else {
            libcellml::ParentedEntity::parent();
            if (local_a0._M_dataplus._M_p == (char *)0x0) {
              lVar4 = 0;
            }
            else {
              lVar4 = __dynamic_cast(local_a0._M_dataplus._M_p,&libcellml::ParentedEntity::typeinfo,
                                     &libcellml::Component::typeinfo,0);
            }
            if (lVar4 == 0) {
              lVar4 = 0;
              this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            }
            else {
              this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)(local_a0._M_string_length + 8) =
                       *(int *)(local_a0._M_string_length + 8) + 1;
                  UNLOCK();
                }
                else {
                  *(int *)(local_a0._M_string_length + 8) =
                       *(int *)(local_a0._M_string_length + 8) + 1;
                }
              }
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length);
            }
            if (lVar4 == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "WHOOPS! Null parent component for equivalent variable!",0x36);
            }
            else {
              poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,local_c0._M_dataplus._M_p,
                                  local_c0._M_string_length);
              libcellml::NamedEntity::name_abi_cxx11_();
              poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar3,local_a0._M_dataplus._M_p,local_a0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
              libcellml::NamedEntity::name_abi_cxx11_();
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar3,(char *)local_80,(long)local_78);
              if (local_80 != local_70) {
                operator_delete(local_80,local_70[0] + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1
                               );
              }
              libcellml::Variable::units();
              _Var1._M_p = local_a0._M_dataplus._M_p;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length
                          );
              }
              if (_Var1._M_p != (char *)0x0) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [",2);
                libcellml::Variable::units();
                libcellml::NamedEntity::name_abi_cxx11_();
                poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,local_a0._M_dataplus._M_p,
                                    local_a0._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                  operator_delete(local_a0._M_dataplus._M_p,
                                  local_a0.field_2._M_allocated_capacity + 1);
                }
                if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
                }
              }
              std::__cxx11::string::_M_replace
                        ((ulong)&local_c0,0,(char *)local_c0._M_string_length,0x10d21b);
            }
            if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            }
          }
          if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
          }
          uVar8 = uVar8 + 1;
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
        std::ostream::put('8');
        std::ostream::flush();
        indent = local_48;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
      }
      uVar5 = libcellml::Component::variableCount();
      uVar8 = local_40;
    } while (local_40 < uVar5);
  }
  includeMaths_00 = SUB41(local_5c,0);
  if (includeMaths_00 != false) {
    libcellml::Component::math_abi_cxx11_();
    iVar2 = std::__cxx11::string::compare((char *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if (iVar2 != 0) {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(indent->_M_dataplus)._M_p,indent->_M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  Maths in the component is:",0x1c)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      libcellml::Component::math_abi_cxx11_();
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_c0._M_dataplus._M_p,local_c0._M_string_length)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  lVar4 = libcellml::ComponentEntity::componentCount();
  if (lVar4 != 0) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(indent->_M_dataplus)._M_p,indent->_M_string_length);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,FIXED_INDENT_abi_cxx11_._M_dataplus._M_p,
                        FIXED_INDENT_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"CHILD COMPONENTS: ",0x12);
    libcellml::ComponentEntity::componentCount();
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," child components",0x11);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::operator+(&local_a0,indent,&FIXED_INDENT_abi_cxx11_);
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_a0,(ulong)FIXED_INDENT_abi_cxx11_._M_dataplus._M_p);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_c0.field_2._M_allocated_capacity = *psVar7;
      local_c0.field_2._8_8_ = plVar6[3];
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar7;
      local_c0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_c0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    uVar8 = 0;
    while( true ) {
      uVar5 = libcellml::ComponentEntity::componentCount();
      if (uVar5 <= uVar8) break;
      libcellml::ComponentEntity::component((ulong)&local_a0);
      printComponent((ComponentPtr *)&local_a0,uVar8,&local_c0,includeMaths_00);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length);
      }
      uVar8 = uVar8 + 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void printComponent(const libcellml::ComponentPtr &component, size_t c, const std::string &indent, bool includeMaths)
{
    if (c == SIZE_MAX) {
        std::cout << "COMPONENT: '" << component->name() << "'";
    } else {
        std::cout << indent << "[" << c + 1 << "]: " << component->name();
    }

    if (component->id() != "") {
        std::cout << ", id: " << component->id();
    }

    std::cout << std::endl;
    std::cout << indent << FIXED_INDENT << "VARIABLES: " << component->variableCount() << " variables" << std::endl;

    // Printing the variables within the component.
    for (size_t v = 0; v < component->variableCount(); ++v) {
        std::cout << indent << FIXED_INDENT << FIXED_INDENT;
        std::cout << "[" << v + 1 << "]: " << component->variable(v)->name();
        if (component->variable(v)->units() != nullptr) {
            std::cout << " [" << component->variable(v)->units()->name() << "]";
        }
        if (component->variable(v)->initialValue() != "") {
            std::cout << ", initial = " << component->variable(v)->initialValue();
        }
        std::cout << std::endl;
        if (component->variable(v)->equivalentVariableCount() > 0) {
            std::cout << indent << FIXED_INDENT << FIXED_INDENT << FIXED_INDENT;
            std::string con = "  └──> ";
            for (size_t e = 0; e < component->variable(v)->equivalentVariableCount(); ++e) {
                auto ev = component->variable(v)->equivalentVariable(e);
                if (ev == nullptr) {
                    std::cout << "WHOOPS! Null equivalent variable!";
                    continue;
                }
                libcellml::ComponentPtr ev_parent = std::dynamic_pointer_cast<libcellml::Component>(ev->parent());
                if (ev_parent == nullptr) {
                    std::cout << "WHOOPS! Null parent component for equivalent variable!";
                    continue;
                }
                std::cout << con << ev_parent->name() << ":" << ev->name();
                if (ev->units() != nullptr) {
                    std::cout << " [" << ev->units()->name() << "]";
                }
                con = ", ";
            }
            std::cout << std::endl;
        }
    }

    // Print the maths within the component.
    if (includeMaths) {
        if (component->math() != "") {
            std::cout << indent << "  Maths in the component is:" << std::endl;
            std::cout << component->math() << std::endl;
        }
    }

    // Print the encapsulated components
    if (component->componentCount() > 0) {
        std::cout << indent << FIXED_INDENT << "CHILD COMPONENTS: " << component->componentCount()
                  << " child components" << std::endl;
        std::string newIndent = indent + FIXED_INDENT + FIXED_INDENT;

        for (size_t c2 = 0; c2 < component->componentCount(); ++c2) {
            auto child = component->component(c2);
            printComponent(child, c2, newIndent, includeMaths);
        }
    }
}